

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

int google::protobuf::internal::UTF8GenericScanFastAscii
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  uint *puVar1;
  int *in_RCX;
  int in_EDX;
  uint *in_RSI;
  bool bVar2;
  int exit_reason;
  int rest_consumed;
  int n;
  uint8 *srclimit8;
  uint8 *srclimit;
  uint8 *src;
  uint8 *isrc;
  int local_50;
  uint *local_38;
  int local_4;
  
  *in_RCX = 0;
  if (in_EDX == 0) {
    local_4 = 0xf1;
  }
  else {
    puVar1 = (uint *)((long)in_RSI + (long)in_EDX);
    local_38 = in_RSI;
    do {
      while( true ) {
        bVar2 = false;
        if ((((ulong)local_38 & 7) != 0) && (bVar2 = false, local_38 < puVar1)) {
          bVar2 = (byte)*local_38 < 0x80;
        }
        if (!bVar2) break;
        local_38 = (uint *)((long)local_38 + 1);
      }
      if (((ulong)local_38 & 7) == 0) {
        while( true ) {
          bVar2 = false;
          if (local_38 < (uint *)((long)puVar1 + -7)) {
            bVar2 = ((*local_38 | local_38[1]) & 0x80808080) == 0;
          }
          if (!bVar2) break;
          local_38 = local_38 + 2;
        }
      }
      while( true ) {
        bVar2 = false;
        if (local_38 < puVar1) {
          bVar2 = (byte)*local_38 < 0x80;
        }
        if (!bVar2) break;
        local_38 = (uint *)((long)local_38 + 1);
      }
      local_4 = UTF8GenericScan((UTF8ScanObj *)isrc,(char *)src,srclimit._4_4_,(int *)srclimit8);
      local_38 = (uint *)((long)local_38 + (long)local_50);
    } while (local_4 == 0xfd);
    *in_RCX = (int)local_38 - (int)in_RSI;
  }
  return local_4;
}

Assistant:

int UTF8GenericScanFastAscii(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  const uint8* isrc =  reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = srclimit - 7;
  int n;
  int rest_consumed;
  int exit_reason;
  do {
    // Check initial few bytes one at a time until 8-byte aligned
    while ((((uintptr_t)src & 0x07) != 0) &&
           (src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    if (((uintptr_t)src & 0x07) == 0) {
      while ((src < srclimit8) &&
             (((reinterpret_cast<const uint32*>(src)[0] |
                reinterpret_cast<const uint32*>(src)[1]) & 0x80808080) == 0)) {
        src += 8;
      }
    }
    while ((src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    // Run state table on the rest
    n = src - isrc;
    exit_reason = UTF8GenericScan(st, str + n, str_length - n, &rest_consumed);
    src += rest_consumed;
  } while ( exit_reason == kExitDoAgain );

  *bytes_consumed = src - isrc;
  return exit_reason;
}